

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O1

void chrono::fea::rotutils::RotAndDRot
               (ChVector<double> *phi,ChMatrix33<double> *Phi,ChMatrix33<double> *Ga)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double coeff [3];
  double local_38;
  double local_30;
  double local_28;
  
  RotCo<chrono::ChVector<double>,double>(3,phi,phi,&local_38);
  dVar1 = phi->m_data[0];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  dVar2 = phi->m_data[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2;
  dVar3 = phi->m_data[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_38 * dVar3;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_38 * dVar2;
  auVar12 = vunpcklpd_avx(auVar20,auVar14);
  auVar21._0_8_ = -(local_38 * dVar2);
  auVar21._8_8_ = 0x8000000000000000;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_38 * dVar1;
  auVar14 = vunpcklpd_avx(auVar21,auVar16);
  dVar4 = dVar1 * local_30;
  dVar5 = dVar2 * local_30;
  dVar6 = dVar3 * local_30;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar5;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar6 * dVar3;
  auVar9 = vfnmsub231sd_fma(auVar37,auVar9,auVar32);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar4 * dVar2;
  auVar9 = vunpcklpd_avx(auVar9,auVar44);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar6;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar4 * dVar1;
  auVar13 = vfnmsub231sd_fma(auVar45,auVar23,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar6 * dVar2;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar6 * dVar1;
  auVar7 = vunpcklpd_avx(auVar41,auVar34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar5 * dVar1;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar4 * dVar3;
  auVar10 = vunpcklpd_avx(auVar42,auVar39);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar5 * dVar3;
  auVar13 = vunpcklpd_avx(auVar13,auVar24);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar5 * dVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar4;
  auVar11 = vfnmsub231sd_fma(auVar11,auVar8,auVar31);
  auVar16 = ZEXT816(0x3ff0000000000000);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = 0.0 - local_38 * dVar3;
  auVar8 = vunpcklpd_avx(auVar16,auVar15);
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar9._0_8_ + auVar8._0_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar9._8_8_ + auVar8._8_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar10._0_8_ + auVar12._0_8_ + 0.0;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar10._8_8_ + auVar12._8_8_ + 0.0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = 0.0 - local_38 * dVar1;
  auVar12 = vunpcklpd_avx(auVar16,auVar17);
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar12._0_8_ + auVar13._0_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar12._8_8_ + auVar13._8_8_;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar7._0_8_ + auVar14._0_8_ + 0.0;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar7._8_8_ + auVar14._8_8_ + 0.0;
  (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar11._0_8_ + 1.0;
  dVar1 = phi->m_data[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  dVar2 = phi->m_data[1];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  dVar3 = phi->m_data[2];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar3;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_30 * dVar3;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_30 * dVar2;
  auVar12 = vunpcklpd_avx(auVar25,auVar7);
  auVar26._0_8_ = -(local_30 * dVar2);
  auVar26._8_8_ = 0x8000000000000000;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_30 * dVar1;
  auVar14 = vunpcklpd_avx(auVar26,auVar22);
  dVar4 = local_28 * dVar1;
  dVar5 = local_28 * dVar2;
  local_28 = local_28 * dVar3;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar5;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_28 * dVar3;
  auVar9 = vfnmsub231sd_fma(auVar40,auVar18,auVar38);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar4;
  auVar7 = vmulsd_avx512f(auVar18,auVar35);
  auVar8 = vunpcklpd_avx512vl(auVar9,auVar7);
  auVar9 = vmulsd_avx512f(auVar35,auVar13);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_28;
  auVar10 = vfnmsub231sd_avx512f(auVar9,auVar27,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_28 * dVar2;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_28 * dVar1;
  auVar9 = vunpcklpd_avx(auVar46,auVar30);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar5 * dVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar4 * dVar3;
  auVar7 = vunpcklpd_avx(auVar47,auVar43);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar5 * dVar3;
  auVar11 = vunpcklpd_avx512vl(auVar10,auVar28);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5 * dVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar4;
  auVar13 = vfnmsub231sd_fma(auVar19,auVar13,auVar36);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = 0.0 - local_30 * dVar3;
  auVar10 = vunpcklpd_avx(auVar16,auVar10);
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar8._0_8_ + auVar10._0_8_;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar8._8_8_ + auVar10._8_8_;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar7._0_8_ + auVar12._0_8_ + 0.0;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar7._8_8_ + auVar12._8_8_ + 0.0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = 0.0 - local_30 * dVar1;
  auVar12 = vunpcklpd_avx(auVar16,auVar12);
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar12._0_8_ + auVar11._0_8_;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar12._8_8_ + auVar11._8_8_;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar9._0_8_ + auVar14._0_8_ + 0.0;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar9._8_8_ + auVar14._8_8_ + 0.0;
  (Ga->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar13._0_8_ + 1.0;
  return;
}

Assistant:

void RotAndDRot(const ChVector<>& phi, ChMatrix33<>& Phi, ChMatrix33<>& Ga) {
    double coeff[COEFF_C];

    CoeffC(phi, phi, coeff);

    ChMatrix33<> Eye(1);
    
    {
        ChStarMatrix33<> Phix(phi * coeff[0]);
        ChStarMatrix33<> pxpx(phi, phi * coeff[1]);
        Phi = Eye + Phix + pxpx;  // I + c[0] * phi x + c[1] * phi x phi x
    }

    {
        ChStarMatrix33<> Phix(phi * coeff[1]);
        ChStarMatrix33<> pxpx(phi, phi * coeff[2]);
        Ga = Eye + Phix + pxpx; // I + c[1] * phi x + c[2] * phi x phi x
    }

    return;
}